

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_constraint.cpp
# Opt level: O2

void animator_changed_demon(Am_Slot slot)

{
  bool bVar1;
  int iVar2;
  Animation_Constraint *this;
  Am_Constraint_Iterator iter;
  Am_Slot local_30;
  Am_Constraint_Iterator local_28;
  
  Am_Constraint_Iterator::Am_Constraint_Iterator(&local_28,&local_30);
  Am_Constraint_Iterator::Start(&local_28);
  while( true ) {
    bVar1 = Am_Constraint_Iterator::Last(&local_28);
    if (bVar1) {
      return;
    }
    this = (Animation_Constraint *)Am_Constraint_Iterator::Get(&local_28);
    iVar2 = (**(this->super_Am_Constraint).super_Am_Registered_Type._vptr_Am_Registered_Type)(this);
    if ((Am_ID_Tag)iVar2 == Animation_Constraint::id) break;
    Am_Constraint_Iterator::Next(&local_28);
  }
  Animation_Constraint::Update(this);
  return;
}

Assistant:

static void
animator_changed_demon(Am_Slot slot)
{
  Am_Constraint_Iterator iter = slot;
  Am_Constraint *curr;
  for (iter.Start(); !iter.Last(); iter.Next()) {
    curr = iter.Get();
    if (curr->ID() == Animation_Constraint::id) {
      ((Animation_Constraint *)curr)->Update();
      break;
    }
  }
}